

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

TrieNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,size_t depth)

{
  ushort uVar1;
  uchar *ptr;
  uint16_t uVar2;
  TrieNode<unsigned_short> *this_00;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar3;
  ulong uVar4;
  long lVar5;
  uint j;
  long lVar6;
  ulong uVar7;
  uchar **__x;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  
  this_00 = (TrieNode<unsigned_short> *)operator_new(0x82000);
  TrieNode<unsigned_short>::TrieNode(this_00);
  uVar4 = (ulong)((long)(bucket->
                        super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(bucket->
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  lVar5 = 0;
  for (uVar7 = 0; uVar7 < ((uint)uVar4 & 0xffffffc0); uVar7 = uVar7 + 0x40) {
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      ptr = *(uchar **)
             ((long)(bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start + lVar6 * 8 + lVar5);
      strings._M_elems[lVar6] = ptr;
      uVar2 = get_char<unsigned_short>(ptr,depth);
      cache._M_elems[lVar6] = uVar2;
    }
    __x = strings._M_elems;
    for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      uVar1 = cache._M_elems[lVar6];
      pvVar3 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
               (this_00->buckets)._M_elems[uVar1];
      if (pvVar3 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        pvVar3 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
        (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this_00->buckets)._M_elems[uVar1] = pvVar3;
      }
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(pvVar3,__x);
      __x = __x + 1;
    }
    lVar5 = lVar5 + 0x200;
  }
  for (; uVar7 < (uVar4 & 0xffffffff); uVar7 = uVar7 + 1) {
    strings._M_elems[0] =
         (bucket->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar7];
    uVar2 = get_char<unsigned_short>(strings._M_elems[0],depth);
    pvVar3 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
             (this_00->buckets)._M_elems[uVar2];
    if (pvVar3 == (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
      pvVar3 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
      (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar3->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->buckets)._M_elems[uVar2] = pvVar3;
    }
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
              (pvVar3,strings._M_elems);
  }
  return this_00;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}